

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void __thiscall
TorController::authchallenge_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t __n;
  ulong uVar10;
  size_t sVar11;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  string_view str;
  Span<const_unsigned_char> s_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedClientHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedServerHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverNonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverHash;
  string local_e8;
  key_type local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      logging_function_01._M_str = "authchallenge_cb";
      logging_function_01._M_len = 0x10;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x57;
      ::LogPrintf_<>(logging_function_01,source_file_01,0x219,ALL,Info,
                     "tor: SAFECOOKIE authentication challenge failed\n");
      return;
    }
    goto LAB_00ad85ad;
  }
  pLVar6 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,TOR,Debug);
  if (bVar4) {
    logging_function._M_str = "authchallenge_cb";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x1fd,TOR,Debug,
                   "SAFECOOKIE authentication challenge successful\n");
  }
  SplitTorReplyLine(&l,(reply->lines).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&l.first,"AUTHCHALLENGE");
  if (iVar5 == 0) {
    ParseTorReplyMapping(&m,&l.second);
    if (m._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      str._M_str = l.second._M_dataplus._M_p;
      str._M_len = l.second._M_string_length;
      SanitizeString_abi_cxx11_(&local_c8,str,0);
      logging_function_04._M_str = "authchallenge_cb";
      logging_function_04._M_len = 0x10;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_04._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_04,source_file_04,0x202,ALL,Info,
                 "tor: Error parsing AUTHCHALLENGE parameters: %s\n",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SERVERHASH","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,&local_c8);
      hex_str._M_str = (pmVar7->_M_dataplus)._M_p;
      hex_str._M_len = pmVar7->_M_string_length;
      ParseHex<unsigned_char>(&serverHash,hex_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SERVERNONCE","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,&local_c8);
      hex_str_00._M_str = (pmVar7->_M_dataplus)._M_p;
      hex_str_00._M_len = pmVar7->_M_string_length;
      ParseHex<unsigned_char>(&serverNonce,hex_str_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pLVar6 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,TOR,Debug);
      if (bVar4) {
        s.m_size = (long)serverHash.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)serverHash.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        s.m_data = serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&local_c8,s);
        s_00.m_size = (long)serverNonce.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)serverNonce.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        s_00.m_data = serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&local_e8,s_00);
        logging_function_02._M_str = "authchallenge_cb";
        logging_function_02._M_len = 0x10;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_02._M_len = 0x57;
        ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_02,source_file_02,0x207,TOR,Debug,
                   "AUTHCHALLENGE ServerHash %s ServerNonce %s\n",&local_c8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((long)serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x20) {
        ComputeResponse(&computedServerHash,&TOR_SAFE_SERVERKEY_abi_cxx11_,&this->cookie,
                        &this->clientNonce,&serverNonce);
        puVar3 = serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        __n = (long)computedServerHash.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)computedServerHash.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        sVar11 = (long)serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if ((__n == sVar11) &&
           ((computedServerHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish ==
             computedServerHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start ||
            (iVar5 = bcmp(computedServerHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          serverHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,__n), iVar5 == 0)))) {
          ComputeResponse(&computedClientHash,&TOR_SAFE_CLIENTKEY_abi_cxx11_,&this->cookie,
                          &this->clientNonce,&serverNonce);
          s_03.m_size = (long)computedClientHash.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)computedClientHash.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          s_03.m_data = computedClientHash.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_e8,s_03);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_e8,0,0,"AUTHENTICATE ",0xd);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if (paVar2 == paVar9) {
            local_c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_c8._M_dataplus._M_p = (pointer)paVar2;
          }
          local_c8._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          local_158 = (code *)0x0;
          pcStack_150 = (code *)0x0;
          local_168._M_unused._M_object = (void *)0x0;
          local_168._8_8_ = 0;
          local_168._M_unused._M_object = operator_new(0x18);
          *(code **)local_168._M_unused._0_8_ = auth_cb;
          *(undefined8 *)((long)local_168._M_unused._0_8_ + 8) = 0;
          *(TorController **)((long)local_168._M_unused._0_8_ + 0x10) = this;
          pcStack_150 = std::
                        _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                        ::_M_invoke;
          local_158 = std::
                      _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                      ::_M_manager;
          TorControlConnection::Command(_conn,&local_c8,(ReplyHandlerCB *)&local_168);
          if (local_158 != (code *)0x0) {
            (*local_158)(&local_168,&local_168,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (computedClientHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            uVar10 = (long)computedClientHash.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage -
                     (long)computedClientHash.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
LAB_00ad8255:
            operator_delete(computedClientHash.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,uVar10);
          }
        }
        else {
          s_01.m_size = sVar11;
          s_01.m_data = puVar3;
          HexStr_abi_cxx11_(&local_c8,s_01);
          s_02.m_size = __n;
          s_02.m_data = computedServerHash.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_e8,s_02);
          logging_function_03._M_str = "authchallenge_cb";
          logging_function_03._M_len = 0x10;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_03._M_len = 0x57;
          ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_03,source_file_03,0x20f,ALL,Info,
                     "tor: ServerHash %s does not match expected ServerHash %s\n",&local_c8,
                     &local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            uVar10 = local_c8.field_2._M_allocated_capacity + 1;
            computedClientHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._M_dataplus._M_p;
            goto LAB_00ad8255;
          }
        }
        if (computedServerHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(computedServerHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)computedServerHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)computedServerHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        logging_function_05._M_str = "authchallenge_cb";
        logging_function_05._M_len = 0x10;
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_05._M_len = 0x57;
        ::LogPrintf_<>(logging_function_05,source_file_05,0x209,ALL,Info,
                       "tor: ServerNonce is not 32 bytes, as required by spec\n");
      }
      if (serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(serverNonce.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)serverNonce.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)serverNonce.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)serverHash.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)serverHash.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&m._M_t);
  }
  else {
    logging_function_00._M_str = "authchallenge_cb";
    logging_function_00._M_len = 0x10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    ::LogPrintf_<>(logging_function_00,source_file_00,0x216,ALL,Info,
                   "tor: Invalid reply to AUTHCHALLENGE\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)l.second._M_dataplus._M_p != &l.second.field_2) {
    operator_delete(l.second._M_dataplus._M_p,l.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)l.first._M_dataplus._M_p != &l.first.field_2) {
    operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00ad85ad:
  __stack_chk_fail();
}

Assistant:

void TorController::authchallenge_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "SAFECOOKIE authentication challenge successful\n");
        std::pair<std::string,std::string> l = SplitTorReplyLine(reply.lines[0]);
        if (l.first == "AUTHCHALLENGE") {
            std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
            if (m.empty()) {
                LogPrintf("tor: Error parsing AUTHCHALLENGE parameters: %s\n", SanitizeString(l.second));
                return;
            }
            std::vector<uint8_t> serverHash = ParseHex(m["SERVERHASH"]);
            std::vector<uint8_t> serverNonce = ParseHex(m["SERVERNONCE"]);
            LogDebug(BCLog::TOR, "AUTHCHALLENGE ServerHash %s ServerNonce %s\n", HexStr(serverHash), HexStr(serverNonce));
            if (serverNonce.size() != 32) {
                LogPrintf("tor: ServerNonce is not 32 bytes, as required by spec\n");
                return;
            }

            std::vector<uint8_t> computedServerHash = ComputeResponse(TOR_SAFE_SERVERKEY, cookie, clientNonce, serverNonce);
            if (computedServerHash != serverHash) {
                LogPrintf("tor: ServerHash %s does not match expected ServerHash %s\n", HexStr(serverHash), HexStr(computedServerHash));
                return;
            }

            std::vector<uint8_t> computedClientHash = ComputeResponse(TOR_SAFE_CLIENTKEY, cookie, clientNonce, serverNonce);
            _conn.Command("AUTHENTICATE " + HexStr(computedClientHash), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else {
            LogPrintf("tor: Invalid reply to AUTHCHALLENGE\n");
        }
    } else {
        LogPrintf("tor: SAFECOOKIE authentication challenge failed\n");
    }
}